

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  size_t sVar3;
  _func_void_j_decompress_ptr *p_Var4;
  JBLOCKROW paJVar5;
  d_derived_tbl *pdVar6;
  boolean bVar7;
  int iVar8;
  uint uVar9;
  uint local_c4;
  uint local_c0;
  int local_b8;
  int look_2;
  int nb_2;
  int look_1;
  int nb_1;
  int look;
  int nb;
  int ci;
  int coef_limit;
  int r;
  int k;
  int s;
  d_derived_tbl *htbl;
  JBLOCKROW block;
  savable_state state;
  bitread_working_state br_state;
  _func_void_j_decompress_ptr *p_Stack_38;
  int bits_left;
  bit_buf_type get_buffer;
  int blkn;
  huff_entropy_ptr entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar2[3].decode_mcu != 0)) ||
     (bVar7 = process_restart(cinfo), bVar7 != 0)) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      state.last_dc_val._8_8_ = cinfo->src->next_input_byte;
      sVar3 = cinfo->src->bytes_in_buffer;
      p_Stack_38 = pjVar2[1].start_pass;
      br_state.cinfo._4_4_ = *(int *)&pjVar2[1].decode_mcu;
      p_Var4 = pjVar2[2].start_pass;
      state._0_8_ = pjVar2[2].decode_mcu;
      state.last_dc_val[1] = *(int *)&pjVar2[3].start_pass;
      for (get_buffer._4_4_ = 0; get_buffer._4_4_ < cinfo->blocks_in_MCU;
          get_buffer._4_4_ = get_buffer._4_4_ + 1) {
        paJVar5 = MCU_data[get_buffer._4_4_];
        pdVar6 = (d_derived_tbl *)(&pjVar2[10].decode_mcu)[get_buffer._4_4_];
        if (br_state.cinfo._4_4_ < 8) {
          bVar7 = jpeg_fill_bit_buffer
                            ((bitread_working_state *)(state.last_dc_val + 2),
                             (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,0);
          if (bVar7 == 0) {
            return 0;
          }
          p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
          br_state.cinfo._4_4_ = (int)br_state.get_buffer;
          if (7 < (int)br_state.get_buffer) goto LAB_0039b958;
          nb_1 = 1;
LAB_0039b9c9:
          r = jpeg_huff_decode((bitread_working_state *)(state.last_dc_val + 2),
                               (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,pdVar6,nb_1);
          if (r < 0) {
            return 0;
          }
          p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
          br_state.cinfo._4_4_ = (int)br_state.get_buffer;
        }
        else {
LAB_0039b958:
          uVar9 = (uint)((long)p_Stack_38 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
          if (pdVar6->look_nbits[(int)uVar9] == 0) {
            nb_1 = 9;
            goto LAB_0039b9c9;
          }
          br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - pdVar6->look_nbits[(int)uVar9];
          r = (int)pdVar6->look_sym[(int)uVar9];
        }
        pdVar6 = (d_derived_tbl *)(&pjVar2[0xf].decode_mcu)[get_buffer._4_4_];
        coef_limit = 1;
        iVar1 = *(int *)((long)&pjVar2[0x14].decode_mcu + (long)get_buffer._4_4_ * 4);
        if (iVar1 == 0) {
          if (r != 0) {
            if (br_state.cinfo._4_4_ < r) {
              bVar7 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,r);
              if (bVar7 == 0) {
                return 0;
              }
              p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - r;
          }
        }
        else {
          if (r != 0) {
            if (br_state.cinfo._4_4_ < r) {
              bVar7 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,r);
              if (bVar7 == 0) {
                return 0;
              }
              p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - r;
            local_c0 = (uint)((long)p_Stack_38 >> ((byte)br_state.cinfo._4_4_ & 0x3f)) & bmask[r];
            if ((int)local_c0 <= bmask[r + -1]) {
              local_c0 = local_c0 - bmask[r];
            }
            r = local_c0;
          }
          iVar8 = state.last_dc_val[(long)cinfo->MCU_membership[get_buffer._4_4_] + -2] + r;
          state.last_dc_val[(long)cinfo->MCU_membership[get_buffer._4_4_] + -2] = iVar8;
          (*paJVar5)[0] = (JCOEF)iVar8;
          for (; coef_limit < iVar1; coef_limit = coef_limit + 1) {
            if (br_state.cinfo._4_4_ < 8) {
              bVar7 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,0);
              if (bVar7 == 0) {
                return 0;
              }
              p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
              if (7 < (int)br_state.get_buffer) goto LAB_0039bbc9;
              nb_2 = 1;
LAB_0039bc3a:
              r = jpeg_huff_decode((bitread_working_state *)(state.last_dc_val + 2),
                                   (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,pdVar6,nb_2);
              if (r < 0) {
                return 0;
              }
              p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            else {
LAB_0039bbc9:
              uVar9 = (uint)((long)p_Stack_38 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
              if (pdVar6->look_nbits[(int)uVar9] == 0) {
                nb_2 = 9;
                goto LAB_0039bc3a;
              }
              br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - pdVar6->look_nbits[(int)uVar9];
              r = (int)pdVar6->look_sym[(int)uVar9];
            }
            uVar9 = r & 0xf;
            if (uVar9 == 0) {
              if (r >> 4 != 0xf) goto LAB_0039bff9;
              coef_limit = coef_limit + 0xf;
            }
            else {
              coef_limit = (r >> 4) + coef_limit;
              if (br_state.cinfo._4_4_ < (int)uVar9) {
                bVar7 = jpeg_fill_bit_buffer
                                  ((bitread_working_state *)(state.last_dc_val + 2),
                                   (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,uVar9);
                if (bVar7 == 0) {
                  return 0;
                }
                p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
                br_state.cinfo._4_4_ = (int)br_state.get_buffer;
              }
              br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - uVar9;
              local_c4 = (uint)((long)p_Stack_38 >> ((byte)br_state.cinfo._4_4_ & 0x3f)) &
                         bmask[(int)uVar9];
              if ((int)local_c4 <= bmask[(int)(uVar9 - 1)]) {
                local_c4 = local_c4 - bmask[(int)uVar9];
              }
              (*paJVar5)[jpeg_natural_order[coef_limit]] = (JCOEF)local_c4;
            }
          }
        }
        for (; coef_limit < 0x40; coef_limit = coef_limit + 1) {
          if (br_state.cinfo._4_4_ < 8) {
            bVar7 = jpeg_fill_bit_buffer
                              ((bitread_working_state *)(state.last_dc_val + 2),
                               (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,0);
            if (bVar7 == 0) {
              return 0;
            }
            p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            if (7 < (int)br_state.get_buffer) goto LAB_0039be8a;
            local_b8 = 1;
LAB_0039befb:
            r = jpeg_huff_decode((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,pdVar6,local_b8);
            if (r < 0) {
              return 0;
            }
            p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
          }
          else {
LAB_0039be8a:
            uVar9 = (uint)((long)p_Stack_38 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
            if (pdVar6->look_nbits[(int)uVar9] == 0) {
              local_b8 = 9;
              goto LAB_0039befb;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - pdVar6->look_nbits[(int)uVar9];
            r = (int)pdVar6->look_sym[(int)uVar9];
          }
          uVar9 = r & 0xf;
          if (uVar9 == 0) {
            if (r >> 4 != 0xf) break;
            coef_limit = coef_limit + 0xf;
          }
          else {
            coef_limit = (r >> 4) + coef_limit;
            if (br_state.cinfo._4_4_ < (int)uVar9) {
              bVar7 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)(state.last_dc_val + 2),
                                 (bit_buf_type)p_Stack_38,br_state.cinfo._4_4_,uVar9);
              if (bVar7 == 0) {
                return 0;
              }
              p_Stack_38 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - uVar9;
          }
        }
LAB_0039bff9:
      }
      cinfo->src->next_input_byte = (JOCTET *)state.last_dc_val._8_8_;
      cinfo->src->bytes_in_buffer = sVar3;
      pjVar2[1].start_pass = p_Stack_38;
      *(int *)&pjVar2[1].decode_mcu = br_state.cinfo._4_4_;
      pjVar2[2].start_pass = p_Var4;
      pjVar2[2].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)state._0_8_;
      *(int *)&pjVar2[3].start_pass = state.last_dc_val[1];
    }
    *(int *)&pjVar2[3].decode_mcu = *(int *)&pjVar2[3].decode_mcu + -1;
    cinfo_local._4_4_ = 1;
  }
  else {
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(boolean)
decode_mcu (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    (*block)[0] = (JCOEF) entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    if (cinfo->lim_Se == 0) continue;
    tbl = compptr->ac_tbl_no;
    k = 0;

    /* Figure F.20: Decode_AC_coefficients */
    do {
      st = entropy->ac_stats[tbl] + 3 * k;
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
      for (;;) {
	k++;
	if (arith_decode(cinfo, st + 1)) break;
	st += 3;
	if (k >= cinfo->lim_Se) {
	  WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	  entropy->ct = -1;			/* spectral overflow */
	  return TRUE;
	}
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	if (arith_decode(cinfo, st)) {
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (arith_decode(cinfo, st)) {
	    if ((m <<= 1) == 0x8000) {
	      WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	      entropy->ct = -1;			/* magnitude overflow */
	      return TRUE;
	    }
	    st += 1;
	  }
	}
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      (*block)[natural_order[k]] = (JCOEF) v;
    } while (k < cinfo->lim_Se);
  }

  return TRUE;
}